

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

ssize_t __thiscall Buffers::read(Buffers *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  reference this_00;
  size_t sVar2;
  value_type *__n;
  uchar *puVar3;
  undefined4 in_register_00000034;
  size_t bufferSize;
  value_type *buf;
  size_t remaining;
  size_t read;
  uchar *out;
  size_t size_local;
  void *outPtr_local;
  Buffers *this_local;
  
  if (__buf == (void *)0x0) {
    this_local = (Buffers *)0x0;
  }
  else {
    remaining = 0;
    buf = (value_type *)__buf;
    while (bVar1 = std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::empty
                             ((list<Buffer,_std::allocator<Buffer>_> *)this),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::front
                          ((list<Buffer,_std::allocator<Buffer>_> *)this);
      sVar2 = Buffer::size(this_00);
      __n = (value_type *)(sVar2 - this->mBufferOffset);
      if (buf <= __n) {
        puVar3 = Buffer::data(this_00);
        memcpy((void *)(CONCAT44(in_register_00000034,__fd) + remaining),
               puVar3 + this->mBufferOffset,(size_t)buf);
        if (buf == __n) {
          this->mBufferOffset = 0;
          std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::pop_front
                    ((list<Buffer,_std::allocator<Buffer>_> *)this);
        }
        else {
          this->mBufferOffset = (long)&buf->bufferData + this->mBufferOffset;
        }
        remaining = (long)&buf->bufferData + remaining;
        break;
      }
      puVar3 = Buffer::data(this_00);
      memcpy((void *)(CONCAT44(in_register_00000034,__fd) + remaining),puVar3 + this->mBufferOffset,
             (size_t)__n);
      remaining = (long)&__n->bufferData + remaining;
      this->mBufferOffset = 0;
      buf = (value_type *)((long)buf - (long)__n);
      bVar1 = LinkedList<Buffer>::isEmpty(&this->mBuffers);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!mBuffers.isEmpty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Buffer.h"
                      ,0x8f,"size_t Buffers::read(void *, size_t)");
      }
      std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::pop_front
                ((list<Buffer,_std::allocator<Buffer>_> *)this);
    }
    this_local = (Buffers *)remaining;
  }
  return (ssize_t)this_local;
}

Assistant:

size_t read(void *outPtr, size_t size)
    {
        if (!size)
            return 0;

        unsigned char *out = static_cast<unsigned char *>(outPtr);
        size_t read = 0, remaining = size;
        while (!mBuffers.empty()) {
            const auto &buf = mBuffers.front();
            const size_t bufferSize = buf.size() - mBufferOffset;

            if (remaining <= bufferSize) {
                memcpy(out + read, buf.data() + mBufferOffset, remaining);
                if (remaining == bufferSize) {
                    mBufferOffset = 0;
                    mBuffers.pop_front();
                } else {
                    mBufferOffset = remaining + mBufferOffset;
                }
                read += remaining;
                break;
            }
            memcpy(out + read, buf.data() + mBufferOffset, bufferSize);
            read += bufferSize;
            mBufferOffset = 0;
            remaining -= bufferSize;
            assert(!mBuffers.isEmpty());
            mBuffers.pop_front();
        }
        return read;
    }